

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_chart_end(nk_context *ctx)

{
  nk_chart *__s;
  size_t __n;
  size_t __n_00;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5df2,"void nk_chart_end(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    __s = &ctx->current->layout->chart;
    __n = (ulong)__s & 3;
    if (__n == 0) {
      __n = 0xb4;
    }
    else {
      __n_00 = -__n + 4;
      memset(__s,0,__n_00);
      memset((void *)((long)__s + __n_00),0,0xb0);
      __s = (nk_chart *)((long)__s + -__n + 0xb4);
    }
    memset(__s,0,__n);
    return;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x5df3,"void nk_chart_end(struct nk_context *)");
}

Assistant:

NK_API void
nk_chart_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_chart *chart;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return;

    win = ctx->current;
    chart = &win->layout->chart;
    NK_MEMSET(chart, 0, sizeof(*chart));
    return;
}